

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::DSPOMDP::Copy
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          DSPOMDP *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  pointer ppSVar1;
  int iVar2;
  undefined4 extraout_var;
  int i;
  ulong uVar3;
  State *local_30;
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(particles->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3) break;
    iVar2 = (*this->_vptr_DSPOMDP[0x16])(this,ppSVar1[uVar3]);
    local_30 = (State *)CONCAT44(extraout_var,iVar2);
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
               &local_30);
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> DSPOMDP::Copy(const vector<State*>& particles) const {
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++)
		copy.push_back(Copy(particles[i]));
	return copy;
}